

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseTrue<0u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  Ch CVar1;
  bool bVar2;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *in_RSI;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDI;
  ParseErrorCode in_stack_ffffffffffffff9c;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 b;
  undefined1 uVar3;
  
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
            ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
             CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  CVar1 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek(in_RSI);
  if (CVar1 == 'r') {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
              ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
               CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  }
  b = false;
  if (CVar1 == 'r') {
    CVar1 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek(in_RSI);
    if (CVar1 == 'u') {
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
                 CONCAT17(b,in_stack_ffffffffffffffa0));
    }
    uVar3 = false;
    b = uVar3;
    if (CVar1 == 'u') {
      CVar1 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek(in_RSI);
      b = CVar1 == 'e';
      if ((bool)b) {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                  ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
                   CONCAT17(uVar3,in_stack_ffffffffffffffa0));
      }
    }
  }
  if ((bool)b == false) {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell(in_RSI);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)CONCAT17(b,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c,0x43507f);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)0x43508b);
  }
  else {
    bVar2 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Bool(in_RDI,(bool)b);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell(in_RSI);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)CONCAT17(b,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c,0x43503f);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)0x43504b);
    }
  }
  return;
}

Assistant:

void ParseTrue(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == 't');
        is.Take();

        if (RAPIDJSON_LIKELY(Consume(is, 'r') && Consume(is, 'u') && Consume(is, 'e'))) {
            if (RAPIDJSON_UNLIKELY(!handler.Bool(true)))
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, is.Tell());
    }